

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::Open(cmake *this,string *dir,bool dryRun)

{
  cmState *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  cmValue cVar4;
  cmValue cVar5;
  ostream *poVar6;
  allocator<char> local_92;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string fullName;
  string local_68;
  string cachePath;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cachePath,"",(allocator<char> *)&fullName);
  SetHomeDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cachePath,"",(allocator<char> *)&fullName);
  SetHomeOutputDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar6 = std::operator<<(poVar6,(string *)dir);
    std::operator<<(poVar6," is not a directory\n");
    return false;
  }
  FindCacheFile(&cachePath,dir);
  bVar2 = LoadCache(this,&cachePath);
  if (bVar2) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,"CMAKE_GENERATOR",(allocator<char> *)&local_68);
    cVar4 = cmState::GetCacheEntryValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (cVar4.Value != (string *)0x0) {
      pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&local_68);
      cVar5 = cmState::GetInitializedCacheValue(pcVar1,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if (cVar5.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_91);
      }
      else {
        std::__cxx11::string::string((string *)&local_68,(string *)cVar5.Value);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&fullName,cVar4.Value,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      CreateGlobalGenerator((cmake *)local_90,(string *)this,(bool)((char)(cmake *)local_90 + '\b'))
      ;
      if (local_90 == (undefined1  [8])0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"")
        ;
        poVar6 = std::operator<<(poVar6,(string *)&fullName);
        std::operator<<(poVar6,"\"\n");
LAB_002aebef:
        uVar3 = 0;
      }
      else {
        pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"CMAKE_PROJECT_NAME",&local_92);
        cVar4 = cmState::GetCacheEntryValue(pcVar1,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (cVar4.Value == (string *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          goto LAB_002aebef;
        }
        uVar3 = (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                             *)local_90)->
                          super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                          )._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                          .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl
                          [0x12]._vptr_cmGlobalGeneratorFactory)(local_90,dir,cVar4.Value,dryRun);
      }
      if (local_90 != (undefined1  [8])0x0) {
        (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                     *)local_90)->
                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                  _vptr_cmGlobalGeneratorFactory)();
      }
      std::__cxx11::string::~string((string *)&fullName);
      goto LAB_002aec0b;
    }
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  uVar3 = 0;
LAB_002aec0b:
  std::__cxx11::string::~string((string *)&cachePath);
  return (bool)uVar3;
}

Assistant:

bool cmake::Open(const std::string& dir, bool dryRun)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return false;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return false;
  }
  cmValue genName = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!genName) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return false;
  }
  cmValue extraGenName =
    this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
  std::string fullName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      *genName, extraGenName ? *extraGenName : "");

  std::unique_ptr<cmGlobalGenerator> gen =
    this->CreateGlobalGenerator(fullName);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \"" << fullName
              << "\"\n";
    return false;
  }

  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return false;
  }

  return gen->Open(dir, *cachedProjectName, dryRun);
}